

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<signed_char,char,short,char,int,char,long_long>
          (String *__return_storage_ptr__,kj *this,char *params,char *params_1,short *params_2,
          char *params_3,int *params_4,char *params_5,longlong *params_6)

{
  char *pcVar1;
  short *value;
  int *value_00;
  longlong *value_01;
  CappedArray<char,_5UL> CVar2;
  CappedArray<char,_26UL> *in_stack_ffffffffffffff28;
  CappedArray<char,_26UL> local_c0;
  char local_91 [1];
  CappedArray<char,_14UL> local_90;
  char local_71 [1];
  CappedArray<char,_8UL> local_70;
  char local_59 [1];
  CappedArray<char,_5UL> local_58;
  size_t local_48;
  char local_40 [4];
  char local_3c;
  NoInfer<int> *local_38;
  int *params_local_4;
  char *params_local_3;
  short *params_local_2;
  char *params_local_1;
  char *params_local;
  
  local_38 = (NoInfer<int> *)params_3;
  params_local_4 = (int *)params_2;
  params_local_3 = params_1;
  params_local_2 = (short *)params;
  params_local_1 = (char *)this;
  params_local = (char *)__return_storage_ptr__;
  pcVar1 = fwd<signed_char>((NoInfer<signed_char> *)this);
  CVar2 = toCharSequence<signed_char>(pcVar1);
  local_58.currentSize = CVar2.currentSize;
  local_48 = local_58.currentSize;
  local_58.content._0_4_ = CVar2.content._0_4_;
  local_40[0] = local_58.content[0];
  local_40[1] = local_58.content[1];
  local_40[2] = local_58.content[2];
  local_40[3] = local_58.content[3];
  local_58.content[4] = CVar2.content[4];
  local_3c = local_58.content[4];
  local_58 = CVar2;
  pcVar1 = fwd<char>((NoInfer<char> *)params_local_2);
  local_59[0] = (char)toCharSequence<char>(pcVar1);
  value = fwd<short>((NoInfer<short> *)params_local_3);
  local_70 = toCharSequence<short>(value);
  pcVar1 = fwd<char>((NoInfer<char> *)params_local_4);
  local_71[0] = (char)toCharSequence<char>(pcVar1);
  value_00 = fwd<int>(local_38);
  toCharSequence<int>(&local_90,value_00);
  pcVar1 = fwd<char>((NoInfer<char> *)params_4);
  local_91[0] = (char)toCharSequence<char>(pcVar1);
  value_01 = fwd<long_long>((NoInfer<long_long> *)params_5);
  toCharSequence<long_long>(&local_c0,value_01);
  _::
  concat<kj::CappedArray<char,5ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_48,(CappedArray<char,_5UL> *)local_59,
             (FixedArray<char,_1UL> *)&local_70,(CappedArray<char,_8UL> *)local_71,
             (FixedArray<char,_1UL> *)&local_90,(CappedArray<char,_14UL> *)local_91,
             (FixedArray<char,_1UL> *)&local_c0,in_stack_ffffffffffffff28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}